

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

uint64 __thiscall google::protobuf::internal::ArenaImpl::SerialArena::SpaceUsed(SerialArena *this)

{
  char *pcVar1;
  size_t sVar2;
  long in_RDI;
  Block *b;
  uint64 space_used;
  size_t in_stack_00000038;
  Block *in_stack_00000040;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = *(long *)(in_RDI + 0x28);
  pcVar1 = Block::Pointer(in_stack_00000040,in_stack_00000038);
  local_10 = local_10 - (long)pcVar1;
  for (local_18 = Block::next(*(Block **)(in_RDI + 0x10)); local_18 != (Block *)0x0;
      local_18 = Block::next(local_18)) {
    sVar2 = Block::pos(local_18);
    local_10 = (sVar2 - 0x18) + local_10;
  }
  return local_10 - 0x48;
}

Assistant:

uint64 ArenaImpl::SerialArena::SpaceUsed() const {
  // Get current block's size from ptr_ (since we can't trust head_->pos().
  uint64 space_used = ptr_ - head_->Pointer(kBlockHeaderSize);
  // Get subsequent block size from b->pos().
  for (Block* b = head_->next(); b; b = b->next()) {
    space_used += (b->pos() - kBlockHeaderSize);
  }
  // Remove the overhead of the SerialArena itself.
  space_used -= kSerialArenaSize;
  return space_used;
}